

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-spawn.c
# Opt level: O3

int run_test_spawn_stdout(void)

{
  int iVar1;
  uv_loop_t *puVar2;
  long lVar3;
  undefined8 *extraout_RDX;
  int64_t eval_b;
  int64_t eval_a;
  uv_stdio_container_t stdio [2];
  uv_pipe_t out;
  uv_stdio_container_t local_118;
  undefined4 local_108;
  uv_pipe_t *local_100;
  uv_pipe_t local_f8;
  
  init_process_options("spawn_helper2",exit_cb);
  puVar2 = uv_default_loop();
  uv_pipe_init(puVar2,&local_f8,0);
  options.stdio = &local_118;
  local_118.flags = UV_IGNORE;
  local_108 = 0x21;
  options.stdio_count = 2;
  local_100 = &local_f8;
  puVar2 = uv_default_loop();
  iVar1 = uv_spawn(puVar2,&process,&options);
  if (iVar1 == 0) {
    iVar1 = uv_read_start((uv_stream_t *)&local_f8,on_alloc,on_read);
    if (iVar1 != 0) goto LAB_001bb771;
    puVar2 = uv_default_loop();
    iVar1 = uv_run(puVar2,UV_RUN_DEFAULT);
    if (iVar1 != 0) goto LAB_001bb77e;
    if (exit_cb_called != 1) goto LAB_001bb78b;
    if (close_cb_called != 2) goto LAB_001bb798;
    printf("output is: %s",output);
    iVar1 = strcmp("hello world\n",output);
    if (iVar1 == 0) {
      puVar2 = uv_default_loop();
      uv_walk(puVar2,close_walk_cb,(void *)0x0);
      uv_run(puVar2,UV_RUN_DEFAULT);
      puVar2 = uv_default_loop();
      iVar1 = uv_loop_close(puVar2);
      if (iVar1 == 0) {
        uv_library_shutdown();
        return 0;
      }
      goto LAB_001bb7b2;
    }
  }
  else {
    run_test_spawn_stdout_cold_1();
LAB_001bb771:
    run_test_spawn_stdout_cold_2();
LAB_001bb77e:
    run_test_spawn_stdout_cold_3();
LAB_001bb78b:
    run_test_spawn_stdout_cold_4();
LAB_001bb798:
    run_test_spawn_stdout_cold_5();
  }
  run_test_spawn_stdout_cold_6();
LAB_001bb7b2:
  run_test_spawn_stdout_cold_7();
  iVar1 = output_used;
  lVar3 = (long)output_used;
  *extraout_RDX = output + lVar3;
  extraout_RDX[1] = 0x400 - lVar3;
  return iVar1;
}

Assistant:

TEST_IMPL(spawn_stdout) {
  int r;
  uv_pipe_t out;
  uv_stdio_container_t stdio[2];

  init_process_options("spawn_helper2", exit_cb);

  uv_pipe_init(uv_default_loop(), &out, 0);
  options.stdio = stdio;
  options.stdio[0].flags = UV_IGNORE;
  options.stdio[1].flags = UV_CREATE_PIPE | UV_WRITABLE_PIPE;
  options.stdio[1].data.stream = (uv_stream_t*) &out;
  options.stdio_count = 2;

  r = uv_spawn(uv_default_loop(), &process, &options);
  ASSERT_OK(r);

  r = uv_read_start((uv_stream_t*) &out, on_alloc, on_read);
  ASSERT_OK(r);

  r = uv_run(uv_default_loop(), UV_RUN_DEFAULT);
  ASSERT_OK(r);

  ASSERT_EQ(1, exit_cb_called);
  ASSERT_EQ(2, close_cb_called); /* Once for process once for the pipe. */
  printf("output is: %s", output);
  ASSERT_OK(strcmp("hello world\n", output));

  MAKE_VALGRIND_HAPPY(uv_default_loop());
  return 0;
}